

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_heat1D_adapt.c
# Opt level: O3

sunrealtype * adapt_mesh(N_Vector y,sunindextype *Nnew,UserData udata)

{
  double dVar1;
  double dVar2;
  int iVar3;
  sunrealtype *psVar4;
  long lVar5;
  double *pdVar6;
  void *__ptr;
  size_t sVar7;
  sunrealtype *psVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  
  psVar4 = udata->x;
  pdVar6 = (double *)N_VGetArrayPointer();
  if (pdVar6 == (double *)0x0) {
    adapt_mesh_cold_2();
  }
  else {
    lVar9 = udata->N;
    __ptr = calloc(lVar9 - 1U,4);
    if (2 < lVar9) {
      dVar1 = udata->refine_tol;
      lVar10 = 0;
      dVar12 = *pdVar6;
      dVar13 = pdVar6[1];
      do {
        dVar2 = pdVar6[lVar10 + 2];
        if (dVar1 < ABS((dVar12 - (dVar13 + dVar13)) + dVar2)) {
          *(undefined8 *)((long)__ptr + lVar10 * 4) = 0x100000001;
        }
        lVar10 = lVar10 + 1;
        dVar12 = dVar13;
        dVar13 = dVar2;
      } while (lVar9 + -2 != lVar10);
    }
    lVar10 = 0;
    if (1 < lVar9) {
      sVar7 = 0;
      do {
        lVar10 = lVar10 + (ulong)(*(int *)((long)__ptr + sVar7 * 4) == 1);
        sVar7 = sVar7 + 1;
      } while (lVar9 - 1U != sVar7);
    }
    lVar11 = lVar9 + lVar10;
    *Nnew = lVar11;
    psVar8 = (sunrealtype *)malloc(lVar11 * 8);
    *psVar8 = *psVar4;
    lVar5 = udata->N;
    lVar9 = lVar9 + lVar10 + -1;
    psVar8[lVar11 + -1] = psVar4[lVar5 + -1];
    if (1 < lVar5) {
      lVar10 = 1;
      lVar11 = 0;
      do {
        iVar3 = *(int *)((long)__ptr + lVar11 * 4);
        if (iVar3 == 1) {
          dVar1 = psVar4[lVar11 + 1];
          psVar8[lVar10] = (psVar4[lVar11] + dVar1) * 0.5;
          psVar8[lVar10 + 1] = dVar1;
          lVar10 = lVar10 + 2;
        }
        else if (iVar3 == 0) {
          psVar8[lVar10] = psVar4[lVar11 + 1];
          lVar10 = lVar10 + 1;
        }
        lVar11 = lVar11 + 1;
      } while (lVar5 + -1 != lVar11);
    }
    lVar10 = 0;
    if (lVar9 < 1) {
      lVar9 = lVar10;
    }
    do {
      if (lVar9 == lVar10) {
        free(__ptr);
        return psVar8;
      }
      pdVar6 = psVar8 + lVar10;
      lVar11 = lVar10 + 1;
      lVar10 = lVar10 + 1;
    } while (*pdVar6 < psVar8[lVar11]);
    adapt_mesh_cold_1();
  }
  return (sunrealtype *)0x0;
}

Assistant:

sunrealtype* adapt_mesh(N_Vector y, sunindextype* Nnew, UserData udata)
{
  sunindextype i, j;
  int* marks = NULL;
  sunrealtype ydd, *xold = NULL, *Y = NULL, *xnew = NULL;
  sunindextype num_refine, N_new;

  /* Access current solution and mesh arrays */
  xold = udata->x;
  Y    = N_VGetArrayPointer(y);
  if (check_flag((void*)Y, "N_VGetArrayPointer", 0)) { return NULL; }

  /* create marking array */
  marks = calloc(udata->N - 1, sizeof(int));

  /* perform marking:
      0 -> leave alone
      1 -> refine */
  for (i = 1; i < udata->N - 1; i++)
  {
    /* approximate scaled second-derivative */
    ydd = Y[i - 1] - TWO * Y[i] + Y[i + 1];

    /* check for refinement */
    if (fabs(ydd) > udata->refine_tol)
    {
      marks[i - 1] = 1;
      marks[i]     = 1;
    }
  }

  /* allocate new mesh */
  num_refine = 0;
  for (i = 0; i < udata->N - 1; i++)
  {
    if (marks[i] == 1) { num_refine++; }
  }
  N_new = udata->N + num_refine;
  *Nnew = N_new; /* Store new array length */
  xnew  = malloc((N_new) * sizeof(sunrealtype));

  /* fill new mesh */
  xnew[0]         = xold[0]; /* store endpoints */
  xnew[N_new - 1] = xold[udata->N - 1];
  j               = 1;
  /* iterate over old intervals */
  for (i = 0; i < udata->N - 1; i++)
  {
    /* if mark is 0, reuse old interval */
    if (marks[i] == 0)
    {
      xnew[j++] = xold[i + 1];
      continue;
    }

    /* if mark is 1, refine old interval */
    if (marks[i] == 1)
    {
      xnew[j++] = PT5 * (xold[i] + xold[i + 1]);
      xnew[j++] = xold[i + 1];
      continue;
    }
  }

  /* verify that new mesh is legal */
  for (i = 0; i < N_new - 1; i++)
  {
    if (xnew[i + 1] <= xnew[i])
    {
      fprintf(stderr, "adapt_mesh error: illegal mesh created\n");
      free(xnew);
      return NULL;
    }
  }

  free(marks); /* Delete marking array */
  return xnew; /* Return with success */
}